

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc2c.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream *this;
  char *pcVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  allocator local_421;
  int num_output_order;
  int num_input_order;
  string local_418;
  vector<double,_std::allocator<double>_> linear_predictive_coefficients;
  vector<double,_std::allocator<double>_> cepstrum;
  LinearPredictiveCoefficientsToCepstrum linear_predictive_coefficients_to_cepstrum;
  ostringstream error_message_4;
  ifstream ifs;
  byte abStack_218 [488];
  
  num_output_order = 0x19;
  num_input_order = num_output_order;
  do {
    while (iVar3 = ya_getopt_long(argc,argv,"m:M:h",(option *)0x0,(int *)0x0), iVar3 == 0x4d) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_4);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_output_order);
      bVar8 = num_output_order < 0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -M option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::__cxx11::string::string((string *)&error_message_4,"lpc2c",(allocator *)&local_418);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
LAB_001028ba:
        std::__cxx11::string::~string((string *)&error_message_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
    }
    if (iVar3 != 0x6d) {
      if (iVar3 != -1) {
        if (iVar3 != 0x68) {
          anon_unknown.dwarf_2adf::PrintUsage((ostream *)&std::cerr);
          return 1;
        }
        anon_unknown.dwarf_2adf::PrintUsage((ostream *)&std::cout);
        return 0;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string((string *)&error_message_4,"lpc2c",(allocator *)&local_418);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
        goto LAB_001028ba;
      }
      if (argc == ya_optind) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = argv[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      this = (ostringstream *)&ifs;
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(this);
        std::operator<<((ostream *)this,"Cannot set translation mode");
        std::__cxx11::string::string((string *)&error_message_4,"lpc2c",(allocator *)&local_418);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
        goto LAB_001028ba;
      }
      std::ifstream::ifstream(this);
      if ((pcVar5 == (char *)0x0) ||
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar5),
         (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          this = (ostringstream *)&std::cin;
        }
        sptk::LinearPredictiveCoefficientsToCepstrum::LinearPredictiveCoefficientsToCepstrum
                  (&linear_predictive_coefficients_to_cepstrum,num_input_order,num_output_order);
        if (linear_predictive_coefficients_to_cepstrum.is_valid_ != false) {
          lVar6 = (long)num_input_order;
          lVar7 = (long)num_output_order;
          std::vector<double,_std::allocator<double>_>::vector
                    (&linear_predictive_coefficients,lVar6 + 1U,(allocator_type *)&error_message_4);
          std::vector<double,_std::allocator<double>_>::vector
                    (&cepstrum,lVar7 + 1U,(allocator_type *)&error_message_4);
          break;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
        std::operator<<((ostream *)&error_message_4,
                        "Failed to initialize LinearPredictiveCoefficientsToCepstrum");
        std::__cxx11::string::string
                  ((string *)&local_418,"lpc2c",(allocator *)&linear_predictive_coefficients);
        sptk::PrintErrorMessage(&local_418,&error_message_4);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
        poVar4 = std::operator<<((ostream *)&error_message_4,"Cannot open file ");
        std::operator<<(poVar4,pcVar5);
        std::__cxx11::string::string
                  ((string *)&local_418,"lpc2c",
                   (allocator *)&linear_predictive_coefficients_to_cepstrum);
        sptk::PrintErrorMessage(&local_418,&error_message_4);
      }
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
      iVar3 = 1;
      goto LAB_00102aec;
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_4);
    bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_input_order);
    bVar8 = num_input_order < 0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar1 || bVar8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
      std::operator<<(poVar4,"non-negative integer");
      std::__cxx11::string::string((string *)&error_message_4,"lpc2c",(allocator *)&local_418);
      sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
      goto LAB_001028ba;
    }
  } while( true );
LAB_0010296c:
  bVar1 = sptk::ReadStream<double>
                    (false,0,0,(int)(lVar6 + 1U),&linear_predictive_coefficients,(istream *)this,
                     (int *)0x0);
  if (!bVar1) {
    iVar3 = 0;
    goto LAB_00102ad8;
  }
  bVar1 = sptk::LinearPredictiveCoefficientsToCepstrum::Run
                    (&linear_predictive_coefficients_to_cepstrum,&linear_predictive_coefficients,
                     &cepstrum);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
    std::operator<<((ostream *)&error_message_4,
                    "Failed to convert linear predictive coefficients to cepstrum");
    std::__cxx11::string::string((string *)&local_418,"lpc2c",&local_421);
    sptk::PrintErrorMessage(&local_418,&error_message_4);
    goto LAB_00102abe;
  }
  bVar1 = sptk::WriteStream<double>(0,(int)(lVar7 + 1U),&cepstrum,(ostream *)&std::cout,(int *)0x0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
    std::operator<<((ostream *)&error_message_4,"Failed to write cepstrum");
    std::__cxx11::string::string((string *)&local_418,"lpc2c",&local_421);
    sptk::PrintErrorMessage(&local_418,&error_message_4);
LAB_00102abe:
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
    iVar3 = 1;
LAB_00102ad8:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&cepstrum.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&linear_predictive_coefficients.super__Vector_base<double,_std::allocator<double>_>);
LAB_00102aec:
    std::ifstream::~ifstream(&ifs);
    return iVar3;
  }
  goto LAB_0010296c;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_input_order(kDefaultNumInputOrder);
  int num_output_order(kDefaultNumOutputOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:M:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lpc2c", error_message);
          return 1;
        }
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &num_output_order) ||
            num_output_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lpc2c", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lpc2c", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lpc2c", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lpc2c", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::LinearPredictiveCoefficientsToCepstrum
      linear_predictive_coefficients_to_cepstrum(num_input_order,
                                                 num_output_order);
  if (!linear_predictive_coefficients_to_cepstrum.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize LinearPredictiveCoefficientsToCepstrum";
    sptk::PrintErrorMessage("lpc2c", error_message);
    return 1;
  }

  const int input_length(num_input_order + 1);
  const int output_length(num_output_order + 1);
  std::vector<double> linear_predictive_coefficients(input_length);
  std::vector<double> cepstrum(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length,
                          &linear_predictive_coefficients, &input_stream,
                          NULL)) {
    if (!linear_predictive_coefficients_to_cepstrum.Run(
            linear_predictive_coefficients, &cepstrum)) {
      std::ostringstream error_message;
      error_message
          << "Failed to convert linear predictive coefficients to cepstrum";
      sptk::PrintErrorMessage("lpc2c", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, cepstrum, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write cepstrum";
      sptk::PrintErrorMessage("lpc2c", error_message);
      return 1;
    }
  }

  return 0;
}